

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Impl::applyStructSizeRequirement
          (Impl *this,RawSchema *raw,uint dataWordCount,uint pointerCount)

{
  Reader node_00;
  uint uVar1;
  ArrayPtr<capnp::word> AVar2;
  Reader node;
  StructReader local_88;
  PointerReader local_58;
  
  local_58.pointer = (WirePointer *)raw->encodedNode;
  local_58.segment = (SegmentReader *)0x0;
  local_58.capTable = (CapTableReader *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  uVar1 = 0;
  _::PointerReader::getStruct(&local_88,&local_58,(word *)0x0);
  if (0x7f < local_88.dataSize) {
    uVar1 = (uint)*(ushort *)((long)local_88.data + 0xe);
  }
  if (dataWordCount <= uVar1) {
    uVar1 = 0;
    if (0xcf < local_88.dataSize) {
      uVar1 = (uint)*(ushort *)((long)local_88.data + 0x18);
    }
    if (pointerCount <= uVar1) {
      return;
    }
  }
  node_00._reader.pointerCount = local_88.pointerCount;
  node_00._reader._38_2_ = local_88._38_2_;
  node_00._reader.dataSize = local_88.dataSize;
  node_00._reader.capTable = local_88.capTable;
  node_00._reader.segment = local_88.segment;
  node_00._reader.data = local_88.data;
  node_00._reader.pointers = local_88.pointers;
  node_00._reader.nestingLimit = local_88.nestingLimit;
  node_00._reader._44_4_ = local_88._44_4_;
  AVar2 = rewriteStructNodeWithSizes(this,node_00,dataWordCount,pointerCount);
  raw->encodedNode = AVar2.ptr;
  raw->encodedSize = (uint32_t)AVar2.size_;
  return;
}

Assistant:

void SchemaLoader::Impl::applyStructSizeRequirement(
    _::RawSchema* raw, uint dataWordCount, uint pointerCount) {
  auto node = readMessageUnchecked<schema::Node>(raw->encodedNode);

  auto structNode = node.getStruct();
  if (structNode.getDataWordCount() < dataWordCount ||
      structNode.getPointerCount() < pointerCount) {
    // Sizes need to be increased.  Must rewrite.
    kj::ArrayPtr<word> words = rewriteStructNodeWithSizes(node, dataWordCount, pointerCount);

    // We don't need to re-validate the node because we know this change could not possibly have
    // invalidated it.  Just remake the unchecked message.
    raw->encodedNode = words.begin();
    raw->encodedSize = words.size();
  }
}